

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnRt1ShadedPalCommand::Execute
          (DrawColumnRt1ShadedPalCommand *this,DrawerThread *thread)

{
  byte bVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint32_t fg;
  uint32_t val;
  int count;
  int pitch;
  uint8_t *dest;
  uint8_t *source;
  uint8_t *colormap;
  uint32_t *fgstart;
  DrawerThread *thread_local;
  DrawColumnRt1ShadedPalCommand *this_local;
  
  fg = DrawerThread::count_for_thread
                 (thread,(this->super_PalRtCommand).yl,
                  ((this->super_PalRtCommand).yh - (this->super_PalRtCommand).yl) + 1);
  if (0 < (int)fg) {
    iVar2 = (this->super_PalRtCommand)._color;
    puVar3 = (this->super_PalRtCommand)._colormap;
    iVar6 = (this->super_PalRtCommand).yl;
    iVar5 = DrawerThread::skipped_by_thread(thread,(this->super_PalRtCommand).yl);
    _count = (this->super_PalRtCommand)._destorg +
             (*(int *)(ylookup + (long)(iVar6 + iVar5) * 4) + (this->super_PalRtCommand).sx);
    puVar4 = thread->dc_temp;
    iVar6 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    dest = puVar4 + (iVar6 * 4 + *(int *)&(this->super_PalRtCommand).super_DrawerCommand.field_0xc);
    iVar6 = (this->super_PalRtCommand)._pitch;
    iVar5 = thread->num_cores;
    do {
      bVar1 = puVar3[*dest];
      uVar7 = Col2RGB8[0x40 - bVar1][*_count] + Col2RGB8[bVar1][iVar2] | 0x1f07c1f;
      *_count = RGB32k.All[uVar7 & uVar7 >> 0xf];
      dest = dest + 4;
      _count = _count + iVar6 * iVar5;
      fg = fg - 1;
    } while (fg != 0);
  }
  return;
}

Assistant:

void DrawColumnRt1ShadedPalCommand::Execute(DrawerThread *thread)
	{
		uint32_t *fgstart;
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		fgstart = &Col2RGB8[0][_color];
		colormap = _colormap;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4 + hx];
		pitch = _pitch * thread->num_cores;

		do {
			uint32_t val = colormap[*source];
			uint32_t fg = fgstart[val<<8];
			val = (Col2RGB8[64-val][*dest] + fg) | 0x1f07c1f;
			*dest = RGB32k.All[val & (val>>15)];
			source += 4;
			dest += pitch;
		} while (--count);
	}